

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::FeatureSet::_InternalSerialize
          (FeatureSet *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((uVar1 & 1) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (1,(this->field_0)._impl_.field_presence_,puVar3);
  }
  if ((uVar1 & 2) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray(2,(this->field_0)._impl_.enum_type_,puVar3);
  }
  if ((uVar1 & 4) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (3,(this->field_0)._impl_.repeated_field_encoding_,puVar3);
  }
  if ((uVar1 & 8) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (4,(this->field_0)._impl_.utf8_validation_,puVar3);
  }
  if ((uVar1 & 0x10) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (5,(this->field_0)._impl_.message_encoding_,puVar3);
  }
  if ((uVar1 & 0x20) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (6,(this->field_0)._impl_.json_format_,puVar3);
  }
  if ((uVar1 & 0x40) != 0) {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (7,(this->field_0)._impl_.enforce_naming_style_,puVar3);
  }
  if ((char)uVar1 < '\0') {
    puVar3 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteEnumToArray
                       (8,(this->field_0)._impl_.default_symbol_visibility_,puVar3);
  }
  puVar3 = internal::ExtensionSet::_InternalSerializeAll
                     (&(this->field_0)._impl_._extensions_,
                      (MessageLite *)_FeatureSet_default_instance_,target,stream);
  uVar2 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar2 & 1) == 0) {
    return puVar3;
  }
  puVar3 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8),puVar3,stream);
  return puVar3;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL FeatureSet::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const FeatureSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.FeatureSet)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .google.protobuf.FeatureSet.FieldPresence field_presence = 1 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_field_presence(), target);
  }

  // optional .google.protobuf.FeatureSet.EnumType enum_type = 2 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        2, this_._internal_enum_type(), target);
  }

  // optional .google.protobuf.FeatureSet.RepeatedFieldEncoding repeated_field_encoding = 3 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        3, this_._internal_repeated_field_encoding(), target);
  }

  // optional .google.protobuf.FeatureSet.Utf8Validation utf8_validation = 4 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_utf8_validation(), target);
  }

  // optional .google.protobuf.FeatureSet.MessageEncoding message_encoding = 5 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        5, this_._internal_message_encoding(), target);
  }

  // optional .google.protobuf.FeatureSet.JsonFormat json_format = 6 [retention = RETENTION_RUNTIME, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        6, this_._internal_json_format(), target);
  }

  // optional .google.protobuf.FeatureSet.EnforceNamingStyle enforce_naming_style = 7 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, targets = TARGET_TYPE_EXTENSION_RANGE, targets = TARGET_TYPE_MESSAGE, targets = TARGET_TYPE_FIELD, targets = TARGET_TYPE_ONEOF, targets = TARGET_TYPE_ENUM, targets = TARGET_TYPE_ENUM_ENTRY, targets = TARGET_TYPE_SERVICE, targets = TARGET_TYPE_METHOD, edition_defaults = {
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_enforce_naming_style(), target);
  }

  // optional .google.protobuf.FeatureSet.VisibilityFeature.DefaultSymbolVisibility default_symbol_visibility = 8 [retention = RETENTION_SOURCE, targets = TARGET_TYPE_FILE, edition_defaults = {
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        8, this_._internal_default_symbol_visibility(), target);
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.FeatureSet)
  return target;
}